

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log_test.c
# Opt level: O3

int main(void)

{
  hdr_histogram *phVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  size_t base64_len;
  size_t encoded_size;
  size_t __nmemb;
  uint8_t *output;
  char *pcVar5;
  char *pcVar6;
  hdr_histogram *hdr_new;
  hdr_histogram *histogram;
  char *data;
  hdr_histogram *local_48;
  hdr_histogram *local_40;
  hdr_histogram *local_38;
  size_t local_30;
  
  tests_run = 0;
  local_48 = (hdr_histogram *)0x0;
  hdr_alloc(3600000000,3,&local_40);
  iVar3 = hdr_log_encode(local_40,(char **)&local_38);
  phVar1 = local_38;
  if (iVar3 == 0) {
    base64_len = strlen((char *)local_38);
    iVar3 = hdr_log_decode(&local_48,(char *)phVar1,base64_len);
    if (iVar3 != 0) {
      pcVar5 = "Failed to decode histogram data";
      goto LAB_0010151b;
    }
    _Var2 = compare_histogram(local_40,local_48);
    if (!_Var2) {
      pcVar5 = "Histograms should be the same";
      goto LAB_0010151b;
    }
    free(local_40);
    free(local_48);
    free(local_38);
    tests_run = tests_run + 1;
    local_38 = (hdr_histogram *)0x0;
    local_40 = (hdr_histogram *)0x0;
    local_48 = (hdr_histogram *)0x0;
    load_histograms();
    phVar1 = raw_histogram;
    iVar3 = hdr_encode_compressed(raw_histogram,(uint8_t **)&local_38,(size_t *)&local_40);
    if (iVar3 != 0) {
      pcVar5 = "Did not encode";
LAB_00101580:
      pcVar6 = hdr_strerror(iVar3);
      puts(pcVar6);
LAB_0010158f:
      pcVar6 = "test_encode_and_decode_compressed";
      goto LAB_00101522;
    }
    iVar3 = hdr_decode_compressed((uint8_t *)local_38,(size_t)local_40,&local_48);
    if (iVar3 != 0) {
      pcVar5 = "Did not decode";
      goto LAB_00101580;
    }
    if (local_48 == (hdr_histogram *)0x0) {
      pcVar5 = "Loaded histogram is null";
      goto LAB_0010158f;
    }
    _Var2 = compare_histogram(phVar1,local_48);
    if (!_Var2) {
      pcVar5 = "Comparison did not match";
      goto LAB_0010158f;
    }
    free(local_48);
    tests_run = tests_run + 1;
    local_38 = (hdr_histogram *)0x0;
    local_40 = (hdr_histogram *)0x0;
    local_48 = (hdr_histogram *)0x0;
    load_histograms();
    phVar1 = cor_histogram;
    iVar3 = hdr_encode_compressed(cor_histogram,(uint8_t **)&local_38,(size_t *)&local_40);
    if (iVar3 != 0) {
      pcVar5 = "Did not encode";
LAB_00101628:
      pcVar6 = hdr_strerror(iVar3);
      puts(pcVar6);
LAB_00101637:
      pcVar6 = "test_encode_and_decode_compressed2";
      goto LAB_00101522;
    }
    iVar3 = hdr_decode_compressed((uint8_t *)local_38,(size_t)local_40,&local_48);
    if (iVar3 != 0) {
      pcVar5 = "Did not decode";
      goto LAB_00101628;
    }
    if (local_48 == (hdr_histogram *)0x0) {
      pcVar5 = "Loaded histogram is null";
      goto LAB_00101637;
    }
    _Var2 = compare_histogram(phVar1,local_48);
    if (!_Var2) {
      pcVar5 = "Comparison did not match";
      goto LAB_00101637;
    }
    free(local_48);
    tests_run = tests_run + 1;
    local_38 = (hdr_histogram *)0x0;
    local_40 = (hdr_histogram *)0x0;
    local_48 = (hdr_histogram *)0x0;
    local_30 = 0;
    hdr_init(1,3600000000,4,&local_40);
    srand(5);
    iVar3 = 0x1f86;
    do {
      phVar1 = local_40;
      iVar4 = rand();
      hdr_record_value(phVar1,(long)iVar4);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    iVar3 = hdr_encode_compressed(local_40,(uint8_t **)&local_48,&local_30);
    if (iVar3 != 0) {
      pcVar5 = "Did not encode";
LAB_00101718:
      pcVar6 = hdr_strerror(iVar3);
      puts(pcVar6);
LAB_00101727:
      pcVar6 = "test_encode_and_decode_compressed_large";
      goto LAB_00101522;
    }
    iVar3 = hdr_decode_compressed((uint8_t *)local_48,local_30,&local_38);
    if (iVar3 != 0) {
      pcVar5 = "Did not decode";
      goto LAB_00101718;
    }
    if (local_38 == (hdr_histogram *)0x0) {
      pcVar5 = "Loaded histogram is null";
      goto LAB_00101727;
    }
    _Var2 = compare_histogram(local_40,local_38);
    if (!_Var2) {
      pcVar5 = "Comparison did not match";
      goto LAB_00101727;
    }
    free(local_40);
    free(local_38);
    tests_run = tests_run + 1;
    local_38 = (hdr_histogram *)0x0;
    local_40 = (hdr_histogram *)0x0;
    load_histograms();
    iVar3 = hdr_encode_compressed(cor_histogram,(uint8_t **)&local_38,(size_t *)&local_40);
    if (iVar3 != 0) {
      pcVar5 = hdr_strerror(iVar3);
      puts(pcVar5);
      pcVar5 = "Did not encode";
LAB_0010183d:
      pcVar6 = "test_encode_and_decode_base64";
      goto LAB_00101522;
    }
    encoded_size = hdr_base64_encoded_len((size_t)local_40);
    __nmemb = hdr_base64_decoded_len(encoded_size);
    pcVar5 = (char *)calloc(encoded_size + 1,1);
    output = (uint8_t *)calloc(__nmemb,1);
    hdr_base64_encode((uint8_t *)local_38,(size_t)local_40,pcVar5,encoded_size);
    hdr_base64_decode(pcVar5,encoded_size,output,__nmemb);
    iVar3 = bcmp(local_38,output,(size_t)local_40);
    if (iVar3 != 0) {
      pcVar5 = "Should be same";
      goto LAB_0010183d;
    }
    tests_run = tests_run + 1;
    local_38 = (hdr_histogram *)0x0;
    local_40 = (hdr_histogram *)0x0;
    local_48 = (hdr_histogram *)0x0;
    load_histograms();
    iVar3 = hdr_encode_compressed(cor_histogram,(uint8_t **)&local_38,(size_t *)&local_40);
    if (iVar3 != 0) {
      pcVar5 = hdr_strerror(iVar3);
      puts(pcVar5);
      pcVar5 = "Did not encode";
LAB_001018d5:
      pcVar6 = "test_bounds_check_on_decode";
      goto LAB_00101522;
    }
    iVar3 = hdr_decode_compressed
                      ((uint8_t *)local_38,(size_t)((long)&local_40[-1].counts + 7),&local_48);
    _Var2 = compare_int64(0x16,(long)iVar3);
    if (!_Var2) {
      pcVar5 = "Should have be invalid";
      goto LAB_001018d5;
    }
    if (local_48 != (hdr_histogram *)0x0) {
      pcVar5 = "Should not have built histogram";
      goto LAB_001018d5;
    }
    tests_run = tests_run + 1;
    pcVar5 = base64_decode_block_decodes_4_chars();
    tests_run = tests_run + 1;
    if (pcVar5 == (char *)0x0) {
      pcVar5 = base64_decode_fails_with_invalid_lengths();
      tests_run = tests_run + 1;
      if (pcVar5 == (char *)0x0) {
        _Var2 = assert_base64_decode("YW55IGNhcm5hbCBwbGVhc3Vy","any carnal pleasur");
        tests_run = tests_run + 1;
        if (_Var2) {
          pcVar5 = base64_decode_decodes_strings_with_padding();
          tests_run = tests_run + 1;
          if (pcVar5 == (char *)0x0) {
            pcVar5 = base64_encode_block_encodes_3_bytes();
            tests_run = tests_run + 1;
            if (pcVar5 == (char *)0x0) {
              iVar3 = hdr_base64_encode((uint8_t *)0x0,9,(char *)0x0,0xb);
              tests_run = tests_run + 1;
              if (iVar3 == 0) {
                pcVar6 = "base64_encode_fails_with_invalid_lengths";
                pcVar5 = "Output length not 4/3 of input length";
              }
              else {
                _Var2 = assert_base64_encode("any carnal pleasur","YW55IGNhcm5hbCBwbGVhc3Vy");
                tests_run = tests_run + 1;
                if (_Var2) {
                  pcVar5 = base64_encode_encodes_with_padding();
                  tests_run = tests_run + 1;
                  if (pcVar5 == (char *)0x0) {
                    pcVar5 = writes_and_reads_log();
                    tests_run = tests_run + 1;
                    if (pcVar5 == (char *)0x0) {
                      pcVar5 = log_reader_aggregates_into_single_histogram();
                      tests_run = tests_run + 1;
                      if (pcVar5 == (char *)0x0) {
                        pcVar5 = log_reader_fails_with_incorrect_version();
                        tests_run = tests_run + 1;
                        if (pcVar5 == (char *)0x0) {
                          pcVar5 = test_string_encode_decode();
                          tests_run = tests_run + 1;
                          if (pcVar5 == (char *)0x0) {
                            pcVar5 = test_string_encode_decode_2();
                            tests_run = tests_run + 1;
                            if (pcVar5 == (char *)0x0) {
                              pcVar5 = decode_v3_log();
                              tests_run = tests_run + 1;
                              if (pcVar5 == (char *)0x0) {
                                pcVar5 = decode_v2_log();
                                tests_run = tests_run + 1;
                                if (pcVar5 == (char *)0x0) {
                                  pcVar5 = decode_v1_log();
                                  tests_run = tests_run + 1;
                                  if (pcVar5 == (char *)0x0) {
                                    pcVar5 = decode_v0_log();
                                    tests_run = tests_run + 1;
                                    if (pcVar5 == (char *)0x0) {
                                      pcVar5 = handle_invalid_log_lines();
                                      tests_run = tests_run + 1;
                                      if (pcVar5 == (char *)0x0) {
                                        pcVar5 = test_encode_and_decode_empty();
                                        tests_run = tests_run + 1;
                                        if (pcVar5 == (char *)0x0) {
                                          free(raw_histogram);
                                          free(cor_histogram);
                                          puts("ALL TESTS PASSED");
                                          iVar3 = 0;
                                          goto LAB_00101540;
                                        }
                                        pcVar6 = "test_encode_and_decode_empty";
                                      }
                                      else {
                                        pcVar6 = "handle_invalid_log_lines";
                                      }
                                    }
                                    else {
                                      pcVar6 = "decode_v0_log";
                                    }
                                  }
                                  else {
                                    pcVar6 = "decode_v1_log";
                                  }
                                }
                                else {
                                  pcVar6 = "decode_v2_log";
                                }
                              }
                              else {
                                pcVar6 = "decode_v3_log";
                              }
                            }
                            else {
                              pcVar6 = "test_string_encode_decode_2";
                            }
                          }
                          else {
                            pcVar6 = "test_string_encode_decode";
                          }
                        }
                        else {
                          pcVar6 = "log_reader_fails_with_incorrect_version";
                        }
                      }
                      else {
                        pcVar6 = "log_reader_aggregates_into_single_histogram";
                      }
                    }
                    else {
                      pcVar6 = "writes_and_reads_log";
                    }
                  }
                  else {
                    pcVar6 = "base64_encode_encodes_with_padding";
                  }
                }
                else {
                  pcVar6 = "base64_encode_encodes_without_padding";
                  pcVar5 = "Encoding without padding";
                }
              }
            }
            else {
              pcVar6 = "base64_encode_block_encodes_3_bytes";
            }
          }
          else {
            pcVar6 = "base64_decode_decodes_strings_with_padding";
          }
        }
        else {
          pcVar6 = "base64_decode_decodes_strings_without_padding";
          pcVar5 = "Encoding without padding";
        }
      }
      else {
        pcVar6 = "base64_decode_fails_with_invalid_lengths";
      }
    }
    else {
      pcVar6 = "base64_decode_block_decodes_4_chars";
    }
  }
  else {
    pcVar5 = "Failed to encode histogram data";
LAB_0010151b:
    pcVar6 = "test_encode_decode_empty";
LAB_00101522:
    tests_run = tests_run + 1;
  }
  printf("hdr_histogram_log_test.%s(): %s\n",pcVar6,pcVar5);
  iVar3 = -(uint)(pcVar5 != (char *)0x0);
LAB_00101540:
  printf("Tests run: %d\n",(ulong)(uint)tests_run);
  return iVar3;
}

Assistant:

static struct mu_result all_tests(void)
{
    tests_run = 0;

    mu_run_test(test_encode_decode_empty);
    mu_run_test(test_encode_and_decode_compressed);
    mu_run_test(test_encode_and_decode_compressed2);
    mu_run_test(test_encode_and_decode_compressed_large);
    mu_run_test(test_encode_and_decode_base64);
    mu_run_test(test_bounds_check_on_decode);

    mu_run_test(base64_decode_block_decodes_4_chars);
    mu_run_test(base64_decode_fails_with_invalid_lengths);
    mu_run_test(base64_decode_decodes_strings_without_padding);
    mu_run_test(base64_decode_decodes_strings_with_padding);

    mu_run_test(base64_encode_block_encodes_3_bytes);
    mu_run_test(base64_encode_fails_with_invalid_lengths);
    mu_run_test(base64_encode_encodes_without_padding);
    mu_run_test(base64_encode_encodes_with_padding);

    mu_run_test(writes_and_reads_log);
    mu_run_test(log_reader_aggregates_into_single_histogram);
    mu_run_test(log_reader_fails_with_incorrect_version);

    mu_run_test(test_string_encode_decode);
    mu_run_test(test_string_encode_decode_2);

    mu_run_test(decode_v3_log);
    mu_run_test(decode_v2_log);
    mu_run_test(decode_v1_log);
    mu_run_test(decode_v0_log);
    mu_run_test(handle_invalid_log_lines);

    mu_run_test(test_encode_and_decode_empty);

    free(raw_histogram);
    free(cor_histogram);

    mu_ok;
}